

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  float fVar1;
  float ortho_projection [4] [4];
  float tmp;
  float B;
  float T;
  float R;
  float L;
  GLenum current_clip_origin;
  bool clip_origin_lower_left;
  ImGui_ImplOpenGL3_Data *bd;
  float local_88 [6];
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  float local_58;
  float local_54;
  undefined4 local_50;
  undefined4 local_4c;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  int local_28;
  byte local_21;
  ImGui_ImplOpenGL3_Data *local_20;
  uint local_14;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_20 = ImGui_ImplOpenGL3_GetBackendData();
  (*imgl3wProcs.ptr[0x1a])(0xbe2);
  (*imgl3wProcs.ptr[6])(0x8006);
  (*imgl3wProcs.ptr[8])(0x302,0x303,1);
  (*imgl3wProcs.ptr[0x16])(0xb44);
  (*imgl3wProcs.ptr[0x16])(0xb71);
  (*imgl3wProcs.ptr[0x16])(0xb90);
  (*imgl3wProcs.ptr[0x1a])(0xc11);
  if (0x135 < local_20->GlVersion) {
    (*imgl3wProcs.ptr[0x16])(0x8f9d);
  }
  if ((local_20->HasPolygonMode & 1U) != 0) {
    (*imgl3wProcs.ptr[0x30])(0x408,0x1b02);
  }
  local_21 = 1;
  if ((local_20->HasClipOrigin & 1U) != 0) {
    local_28 = 0;
    (*imgl3wProcs.ptr[0x22])(0x935c,&local_28);
    if (local_28 == 0x8ca2) {
      local_21 = 0;
    }
  }
  (*imgl3wProcs.ptr[0x3a])(0,0,(ulong)local_c,(ulong)local_10);
  local_2c = *(float *)(local_8 + 0x20);
  local_30 = *(float *)(local_8 + 0x20) + *(float *)(local_8 + 0x28);
  local_34 = *(float *)(local_8 + 0x24);
  fVar1 = *(float *)(local_8 + 0x24) + *(float *)(local_8 + 0x2c);
  local_38 = fVar1;
  if ((local_21 & 1) == 0) {
    local_3c = local_34;
    local_38 = local_34;
    local_34 = fVar1;
  }
  local_88[0] = 2.0 / (local_30 - local_2c);
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  local_88[4] = 0.0;
  local_88[5] = 2.0 / (local_34 - local_38);
  local_70 = 0;
  local_6c = 0;
  local_68 = 0;
  local_64 = 0;
  local_60 = 0xbf800000;
  local_5c = 0;
  local_58 = (local_30 + local_2c) / (local_2c - local_30);
  local_54 = (local_34 + local_38) / (local_38 - local_34);
  local_50 = 0;
  local_4c = 0x3f800000;
  (*imgl3wProcs.ptr[0x38])((ulong)local_20->ShaderHandle);
  (*imgl3wProcs.ptr[0x36])((ulong)(uint)local_20->AttribLocationTex,0);
  (*imgl3wProcs.ptr[0x37])((ulong)(uint)local_20->AttribLocationProjMtx,1,0,local_88);
  if ((0x149 < local_20->GlVersion) || ((local_20->GlProfileIsES3 & 1U) != 0)) {
    (*imgl3wProcs.ptr[3])(0);
  }
  (*imgl3wProcs.ptr[5])((ulong)local_14);
  (*imgl3wProcs.ptr[2])(0x8892,(ulong)local_20->VboHandle);
  (*imgl3wProcs.ptr[2])(0x8893,(ulong)local_20->ElementsHandle);
  (*imgl3wProcs.ptr[0x1b])((ulong)local_20->AttribLocationVtxPos);
  (*imgl3wProcs.ptr[0x1b])((ulong)local_20->AttribLocationVtxUV);
  (*imgl3wProcs.ptr[0x1b])((ulong)local_20->AttribLocationVtxColor);
  (*imgl3wProcs.ptr[0x39])((ulong)local_20->AttribLocationVtxPos,2,0x1406,0,0x14,0);
  (*imgl3wProcs.ptr[0x39])((ulong)local_20->AttribLocationVtxUV,2,0x1406,0,0x14,8);
  (*imgl3wProcs.ptr[0x39])((ulong)local_20->AttribLocationVtxColor,4,0x1401,1,0x14,0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();

    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (bd->GlVersion >= 310)
        glDisable(GL_PRIMITIVE_RESTART);
#endif
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    if (bd->HasPolygonMode)
        glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)
#if defined(GL_CLIP_ORIGIN)
    bool clip_origin_lower_left = true;
    if (bd->HasClipOrigin)
    {
        GLenum current_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&current_clip_origin);
        if (current_clip_origin == GL_UPPER_LEFT)
            clip_origin_lower_left = false;
    }
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    GL_CALL(glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height));
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
#if defined(GL_CLIP_ORIGIN)
    if (!clip_origin_lower_left) { float tmp = T; T = B; B = tmp; } // Swap top and bottom if origin is upper left
#endif
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(bd->ShaderHandle);
    glUniform1i(bd->AttribLocationTex, 0);
    glUniformMatrix4fv(bd->AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);

#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (bd->GlVersion >= 330 || bd->GlProfileIsES3)
        glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 and GL ES 3.0 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    GL_CALL(glBindBuffer(GL_ARRAY_BUFFER, bd->VboHandle));
    GL_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, bd->ElementsHandle));
    GL_CALL(glEnableVertexAttribArray(bd->AttribLocationVtxPos));
    GL_CALL(glEnableVertexAttribArray(bd->AttribLocationVtxUV));
    GL_CALL(glEnableVertexAttribArray(bd->AttribLocationVtxColor));
    GL_CALL(glVertexAttribPointer(bd->AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)offsetof(ImDrawVert, pos)));
    GL_CALL(glVertexAttribPointer(bd->AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)offsetof(ImDrawVert, uv)));
    GL_CALL(glVertexAttribPointer(bd->AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE, sizeof(ImDrawVert), (GLvoid*)offsetof(ImDrawVert, col)));
}